

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Comp::reset(V2Comp *this)

{
  long lVar1;
  
  for (lVar1 = -8; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(undefined4 *)((long)this->rmsval + lVar1) = 0;
    *(undefined4 *)((long)this->dbuf + lVar1 + -4) = 0;
    *(undefined4 *)((long)this->peakval + lVar1) = 0x3f800000;
  }
  memset(this->rmsbuf,0,0x10000);
  this->rmscnt = 0;
  return;
}

Assistant:

void reset()
    {
        for (int i=0; i < 2; i++)
        {
            peakval[i] = 0.0f;
            rmsval[i] = 0.0f;
            curgain[i] = 1.0f;
        }
        memset(rmsbuf, 0, sizeof(rmsbuf));
        rmscnt = 0;
    }